

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall TimerTest_basic_Test::~TimerTest_basic_Test(TimerTest_basic_Test *this)

{
  TimerTest_basic_Test *this_local;
  
  ~TimerTest_basic_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TimerTest, basic) {
	timer timer_obj;

	// Check default state
	EXPECT_EQ(timer_obj.next(), timer::time_point_t{});
	EXPECT_EQ(timer_obj.period(), timer::duration_t{ 0 });
	EXPECT_EQ(timer_obj.function(), nullptr);
	EXPECT_TRUE(timer_obj.null());
	EXPECT_FALSE(timer_obj.detached());

	// Should have no effect
	timer_obj.detach();
	timer_obj.cancel();

	// Verify state unchanged
	EXPECT_EQ(timer_obj.next(), timer::time_point_t{});
	EXPECT_EQ(timer_obj.period(), timer::duration_t{ 0 });
	EXPECT_EQ(timer_obj.function(), nullptr);
	EXPECT_TRUE(timer_obj.null());
	EXPECT_FALSE(timer_obj.detached());
}